

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O2

void print2Dfield(double **field,int sizeX,int sizeY)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (field == (double **)0x0) {
    puts("The field is invalid. Please check your input!");
    return;
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)sizeX;
  if (sizeX < 1) {
    uVar4 = uVar3;
  }
  uVar1 = (ulong)(uint)sizeY;
  if (sizeY < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      printf("%5g\t",field[uVar2][uVar3]);
    }
    putchar(10);
  }
  putchar(10);
  return;
}

Assistant:

void print2Dfield (REAL** field, int sizeX, int sizeY)
{
	if (field == NULL)
	{
		printf("The field is invalid. Please check your input!\n");
		return;
	}
	for (int j = 0; j < sizeY; j++)
	{
		for (int i = 0; i < sizeX; i++)
		{
			printf("%5g\t",field[i][j]);
		}
		printf("\n");
	}
	printf("\n"); /* Add another empty line for better readability in the output */
	return;
}